

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

bool __thiscall
google::
dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::serialize<ValueSerializer,_IO_FILE>
          (dense_hashtable<std::pair<std::pair<int,int>const,int>,std::pair<int,int>,TransparentHasher,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,FILE *param_2)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  undefined7 extraout_var;
  ulong uVar4;
  size_t sVar5;
  undefined7 extraout_var_00;
  undefined7 uVar6;
  long lVar7;
  int iVar8;
  int bit;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  byte local_3e;
  ValueSerializer local_3d;
  uint local_3c;
  long local_38;
  
  dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                    ((_IO_FILE *)param_2,0x13578642,4);
  if (((bVar3) &&
      (bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                         ((_IO_FILE *)param_2,*(unsigned_long *)(this + 0x60),8), bVar3)) &&
     (bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                        ((_IO_FILE *)param_2,*(unsigned_long *)(this + 0x58),8), bVar3)) {
    uVar11 = *(ulong *)(this + 0x60);
    uVar4 = CONCAT71(extraout_var,uVar11 == 0);
    if (uVar11 != 0) {
      local_38 = 0;
      uVar12 = 0;
      do {
        iVar8 = *(int *)(this + 0x38);
        piVar10 = (int *)(*(long *)(this + 0x78) + local_38);
        lVar7 = 0;
        local_3e = 0;
        do {
          if (uVar12 + lVar7 < uVar11) {
            iVar8 = iVar8 + 1;
            iVar1 = *piVar10;
            *(int *)(this + 0x38) = iVar8;
            if (*(int *)(this + 0x44) != iVar1) {
              local_3e = local_3e | (byte)(1 << ((byte)lVar7 & 0x1f));
            }
          }
          lVar7 = lVar7 + 1;
          piVar10 = piVar10 + 3;
        } while (lVar7 != 8);
        local_3c = (uint)uVar4;
        sVar5 = fwrite(&local_3e,1,1,param_2);
        bVar2 = local_3e;
        if (sVar5 != 1) {
LAB_00990803:
          uVar4 = (ulong)local_3c;
          break;
        }
        lVar9 = 0;
        uVar6 = 0;
        lVar7 = local_38;
        do {
          if (((bVar2 >> ((uint)lVar9 & 0x1f) & 1) != 0) &&
             (bVar3 = ValueSerializer::operator()
                                (&local_3d,(_IO_FILE *)param_2,
                                 (pair<const_std::pair<int,_int>,_int> *)
                                 (*(long *)(this + 0x78) + lVar7)), uVar6 = extraout_var_00, !bVar3)
             ) goto LAB_00990803;
          lVar9 = lVar9 + 1;
          lVar7 = lVar7 + 0xc;
        } while (lVar9 != 8);
        uVar12 = uVar12 + 8;
        uVar11 = *(ulong *)(this + 0x60);
        local_38 = local_38 + 0x60;
        uVar4 = CONCAT71(uVar6,uVar12 >= uVar11);
      } while (uVar12 < uVar11);
    }
  }
  else {
    uVar4 = 0;
  }
  return (bool)((byte)uVar4 & 1);
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }